

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

void __thiscall Parse::SMTLIB2::readDeclareSort(SMTLIB2 *this,string *name,string *arity)

{
  pointer pcVar1;
  Symbol *this_00;
  bool bVar2;
  uint uVar3;
  OperatorType *type;
  undefined8 *puVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  uint val;
  bool added;
  string pName;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined1 local_160 [48];
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  bVar2 = isAlreadyKnownSymbol(this,&local_f0);
  if (bVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+(&local_110,"Redeclaring built-in, declared or defined sort symbol: ",name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
    if (pbVar8 == pbVar6) {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
      local_160._8_8_ = plVar5[3];
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    }
    else {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
    }
    *plVar5 = (long)pbVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_130,this->_topLevelExpr,true);
    std::operator+(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    plVar5 = (long *)std::__cxx11::string::append(local_160 + 0x10);
    local_90 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_90 == plVar7) {
      local_80 = *plVar7;
      uStack_78 = (undefined4)plVar5[3];
      uStack_74 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    *puVar4 = &PTR_cry_00b69f40;
    puVar4[1] = puVar4 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar4 + 1),local_90,local_88 + (long)local_90);
    *puVar4 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar4 + 5) = 0;
    puVar4[6] = puVar4 + 8;
    puVar4[7] = 0;
    *(undefined1 *)(puVar4 + 8) = 0;
    __cxa_throw(puVar4,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  pcVar1 = (arity->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + arity->_M_string_length);
  bVar2 = ::Lib::StringUtils::isPositiveInteger(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    bVar2 = ::Lib::Int::stringToUnsignedInt(arity,(uint *)&stack0xfffffffffffffe8c);
    if (bVar2) {
      uVar3 = Kernel::Signature::addTypeCon
                        (DAT_00b7e1b0,&local_f0,in_stack_fffffffffffffe8c,(bool *)(local_160 + 0x10)
                        );
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_f0._M_dataplus._M_p,
                 local_f0._M_dataplus._M_p + local_f0._M_string_length);
      ::Lib::
      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert(&this->_declaredSymbols,&local_70,
               (pair<unsigned_int,_Parse::SMTLIB2::SymbolType>)((ulong)uVar3 | 0x200000000));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      this_00 = (DAT_00b7e1b0->_typeCons)._stack[uVar3];
      type = Kernel::OperatorType::getTypeConType(in_stack_fffffffffffffe8c);
      Kernel::Signature::Symbol::setType(this_00,type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+(&local_110,"Couldn\'t convert sort arity: ",arity);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
    if (pbVar8 == pbVar6) {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
      local_160._8_8_ = plVar5[3];
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    }
    else {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
    }
    *plVar5 = (long)pbVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_130,this->_topLevelExpr,true);
    std::operator+(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    plVar5 = (long *)std::__cxx11::string::append(local_160 + 0x10);
    local_d0 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_d0 == plVar7) {
      local_c0 = *plVar7;
      uStack_b8 = (undefined4)plVar5[3];
      uStack_b4 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar7;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    *puVar4 = &PTR_cry_00b69f40;
    puVar4[1] = puVar4 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar4 + 1),local_d0,local_c8 + (long)local_d0);
    *puVar4 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar4 + 5) = 0;
    puVar4[6] = puVar4 + 8;
    puVar4[7] = 0;
    *(undefined1 *)(puVar4 + 8) = 0;
    __cxa_throw(puVar4,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
  std::operator+(&local_110,"Unrecognized declared sort arity: ",arity);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
  if (pbVar8 == pbVar6) {
    local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
    local_160._8_8_ = plVar5[3];
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  }
  else {
    local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
  }
  *plVar5 = (long)pbVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_130,this->_topLevelExpr,true);
  std::operator+(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  plVar5 = (long *)std::__cxx11::string::append(local_160 + 0x10);
  local_b0 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_b0 == plVar7) {
    local_a0 = *plVar7;
    uStack_98 = (undefined4)plVar5[3];
    uStack_94 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  *puVar4 = &PTR_cry_00b69f40;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar4 + 1),local_b0,local_a8 + (long)local_b0);
  *puVar4 = &PTR_cry_00b6a028;
  *(undefined4 *)(puVar4 + 5) = 0;
  puVar4[6] = puVar4 + 8;
  puVar4[7] = 0;
  *(undefined1 *)(puVar4 + 8) = 0;
  __cxa_throw(puVar4,&::Lib::UserErrorException::typeinfo,
              ::Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::readDeclareSort(const std::string& name, const std::string& arity)
{
  std::string pName = name + TYPECON_POSTFIX;
  if (isAlreadyKnownSymbol(pName)) {
    USER_ERROR_EXPR("Redeclaring built-in, declared or defined sort symbol: "+name);
  }

  if (not StringUtils::isPositiveInteger(arity)) {
    USER_ERROR_EXPR("Unrecognized declared sort arity: "+arity);
  }

  unsigned val;
  if (!Int::stringToUnsignedInt(arity, val)) {
    USER_ERROR_EXPR("Couldn't convert sort arity: "+arity);
  }

  bool added;
  unsigned srt = env.signature->addTypeCon(pName,val,added);
  ASS(added);
  ALWAYS(_declaredSymbols.insert(pName,make_pair(srt,SymbolType::TYPECON)));
  env.signature->getTypeCon(srt)->setType(OperatorType::getTypeConType(val));
}